

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte *pbVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  char *pcVar7;
  undefined8 uVar8;
  uchar *compr;
  uchar *uncompr;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  size_t sVar14;
  uchar *__ptr;
  void *pvVar15;
  void *__ptr_00;
  undefined4 *__ptr_01;
  uint *__ptr_02;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  size_t sVar16;
  undefined8 in_R8;
  uint32_t check_dictionary_len;
  uint8_t check_dictionary [32768];
  uint local_80a4;
  uchar *local_80a0;
  undefined4 local_8098;
  undefined8 local_8090;
  uchar *local_8088;
  undefined4 local_8080;
  undefined8 local_8078;
  long local_8068;
  undefined8 local_8060;
  undefined8 uStack_8058;
  undefined8 local_8050;
  uint local_8044;
  undefined8 local_8038;
  ulong uStack_8030;
  ulong local_8028;
  uchar *puStack_8020;
  ulong local_8018;
  ulong uStack_8010;
  undefined8 local_8008;
  long lStack_8000;
  undefined8 local_7ff8;
  undefined8 uStack_7ff0;
  undefined8 local_7fe8;
  ulong uStack_7fe0;
  undefined8 local_7fd8;
  
  pcVar7 = (char *)zlibng_version();
  if (*pcVar7 != '2') {
    main_cold_1();
    uVar9 = extraout_RAX_01;
LAB_001037b3:
    pcVar7 = "compress";
    goto LAB_001036cb;
  }
  pcVar7 = (char *)zlibng_version();
  iVar3 = strcmp(pcVar7,"2.2.4");
  if (iVar3 != 0) {
    main_cold_2();
  }
  uVar8 = zng_zlibCompileFlags();
  printf("zlib-ng version %s = 0x%08lx, compile flags = 0x%lx\n","2.2.4",0x20204f0,uVar8);
  compr = (uchar *)calloc(40000,1);
  uncompr = (uchar *)calloc(40000,1);
  if ((compr == (uchar *)0x0) || (uncompr == (uchar *)0x0)) {
LAB_00103770:
    pcVar7 = "out of memory\n";
    goto LAB_001036db;
  }
  local_8038 = (char *)0x9c40;
  local_80a0 = (uchar *)0x9c40;
  uVar9 = zng_compress(compr,&local_8038,"hello, hello!",0xe);
  if ((int)uVar9 != 0) goto LAB_001037b3;
  builtin_memcpy(uncompr,"garbage",8);
  uVar9 = zng_uncompress(uncompr,&local_80a0,compr,local_8038);
  if ((int)uVar9 != 0) {
    pcVar7 = "uncompress";
    goto LAB_001036cb;
  }
  iVar3 = strcmp((char *)uncompr,"hello, hello!");
  if (iVar3 != 0) {
    pcVar7 = "bad uncompress\n";
    goto LAB_001036db;
  }
  printf("uncompress(): %s\n",uncompr);
  if (argc < 2) {
    pcVar7 = "foo.gz";
  }
  else {
    pcVar7 = argv[1];
  }
  lVar10 = zng_gzopen(pcVar7,"wb");
  if (lVar10 == 0) {
LAB_00103764:
    pcVar7 = "gzopen error\n";
    goto LAB_001036db;
  }
  zng_gzputc(lVar10,0x68);
  iVar3 = zng_gzputs(lVar10,"ello");
  if (iVar3 == 4) {
    iVar3 = zng_gzprintf(lVar10,", %s!","hello");
    if (iVar3 != 8) {
      uncompr = (uchar *)zng_gzerror(lVar10,&local_8038);
      pcVar7 = "gzprintf err: %s\n";
      goto LAB_001038e6;
    }
    lVar11 = zng_gzseek(lVar10,1,1);
    if (lVar11 < 0) {
      uncompr = (uchar *)zng_gztell(lVar10);
      pcVar7 = "gzseek error, gztell=%ld\n";
      goto LAB_001038e6;
    }
    iVar3 = zng_gzsetparams(lVar10,9,0);
    if (iVar3 != 0) {
      uncompr = (uchar *)zng_gzerror(lVar10,&local_8038);
      pcVar7 = "gzsetparams err: %s\n";
      goto LAB_001038e6;
    }
    lVar11 = zng_gzfwrite("hello, hello!",0xe,1,lVar10);
    if (lVar11 == 0) {
      uncompr = (uchar *)zng_gzerror(lVar10,&local_8038);
      pcVar7 = "gzfwrite err: %s\n";
      goto LAB_001038e6;
    }
    iVar3 = zng_gzflush(lVar10,2);
    if (iVar3 != 0) {
      uncompr = (uchar *)zng_gzerror(lVar10,&local_8038);
      pcVar7 = "gzflush err: %s\n";
      goto LAB_001038e6;
    }
    lVar11 = zng_gzoffset(lVar10);
    if (lVar11 < 1) {
      uncompr = (uchar *)zng_gzerror(lVar10,&local_8038);
      pcVar7 = "gzoffset err: %s\n";
      goto LAB_001038e6;
    }
    zng_gzclose(lVar10);
    piVar12 = (int *)zng_gzopen(pcVar7,"rb");
    if (piVar12 == (int *)0x0) goto LAB_00103764;
    builtin_memcpy(uncompr,"garbages",9);
    iVar3 = zng_gzread(piVar12,uncompr,40000);
    if (iVar3 != 0x1c) {
      uncompr = (uchar *)zng_gzerror(piVar12,&local_8038);
      pcVar7 = "gzread err: %s\n";
      goto LAB_001038e6;
    }
    iVar3 = strcmp((char *)uncompr,"hello, hello!");
    if (iVar3 != 0) {
      pcVar7 = "bad gzread: %s\n";
      goto LAB_001038e6;
    }
    printf("gzread(): %s\n",uncompr);
    iVar3 = zng_gzeof(piVar12);
    if (iVar3 != 1) {
      pcVar7 = "gzeof err: not reporting end of stream\n";
      goto LAB_001036db;
    }
    lVar10 = zng_gzseek(piVar12,0xffffffffffffffea,1);
    if ((lVar10 != 6) || (lVar13 = zng_gztell(piVar12), lVar13 != 6)) {
LAB_00103722:
      uVar8 = zng_gztell(piVar12);
      error("gzseek error, pos=%ld, gztell=%ld\n",lVar10,uVar8);
      uVar9 = extraout_RAX_00;
LAB_0010373e:
      pcVar7 = "inflateInit";
      goto LAB_001036cb;
    }
    if (*piVar12 == 0) {
      uVar4 = zng_gzgetc(piVar12);
    }
    else {
      *piVar12 = *piVar12 + -1;
      *(long *)(piVar12 + 4) = *(long *)(piVar12 + 4) + 1;
      pbVar1 = *(byte **)(piVar12 + 2);
      *(byte **)(piVar12 + 2) = pbVar1 + 1;
      uVar4 = (uint)*pbVar1;
    }
    if (uVar4 != 0x20) {
      pcVar7 = "gzgetc error\n";
      goto LAB_001036db;
    }
    iVar3 = zng_gzungetc(0x20,piVar12);
    if (iVar3 != 0x20) {
      pcVar7 = "gzungetc error\n";
      goto LAB_001036db;
    }
    builtin_memcpy(uncompr,"garbages",9);
    zng_gzgets(piVar12,uncompr,40000);
    sVar14 = strlen((char *)uncompr);
    if (sVar14 != 7) {
      uncompr = (uchar *)zng_gzerror(piVar12,&local_8038);
      pcVar7 = "gzgets err after gzseek: %s\n";
      goto LAB_001038e6;
    }
    iVar3 = strcmp((char *)uncompr," hello!");
    if (iVar3 == 0) {
      printf("gzgets() after gzseek: %s\n",uncompr);
      lVar10 = zng_gzseek(piVar12,0xe,0);
      if ((lVar10 == 0xe) && (lVar13 = zng_gztell(piVar12), lVar13 == 0xe)) {
        iVar3 = zng_gzeof(piVar12);
        if (iVar3 == 0) {
          builtin_memcpy(uncompr,"garbages",9);
          zng_gzfread(uncompr,40000,1,piVar12);
          iVar3 = strcmp((char *)uncompr,"hello, hello!");
          if (iVar3 == 0) {
            printf("gzgets(): %s\n",uncompr);
            lVar10 = zng_gzoffset(piVar12);
            if ((lVar10 < 0) || (lVar10 != lVar11 + 10)) {
              pcVar7 = "gzoffset err: wrong offset at end\n";
            }
            else {
              zng_gzfread(uncompr,0xffffffffffffffff,0xffffffffffffffff);
              zng_gzerror(piVar12,&local_8038);
              if ((int)local_8038 == 0) {
                pcVar7 = "gzerror err: no error returned\n";
              }
              else {
                zng_gzclearerr(piVar12);
                zng_gzerror(piVar12,&local_8038);
                if ((int)local_8038 == 0) {
                  zng_gzclose(piVar12);
                  iVar3 = zng_gzclose(0);
                  if (iVar3 == -2) {
                    local_8028 = 0;
                    uStack_8010 = 0;
                    local_7ff8 = 0;
                    uStack_7ff0 = 0;
                    local_7fe8 = 0;
                    uVar9 = zng_deflateInit(&local_8038,0xffffffff);
                    if ((int)uVar9 != 0) goto LAB_00103712;
                    local_8038 = "hello, hello!";
                    puStack_8020 = compr;
                    do {
                      if ((local_8028 == 0xe) || (39999 < uStack_8010)) goto LAB_00102aa1;
                      local_8018 = CONCAT44(local_8018._4_4_,1);
                      uStack_8030 = CONCAT44(uStack_8030._4_4_,1);
                      uVar9 = zng_deflate(&local_8038,0);
                    } while ((int)uVar9 == 0);
                    goto LAB_001036bd;
                  }
                }
                else {
                  error("gzclearerr err: not zero %d\n");
                }
                pcVar7 = "gzclose unexpected return when handle null\n";
              }
            }
          }
          else {
            pcVar7 = "bad gzgets\n";
          }
        }
        else {
          pcVar7 = "gzeof err: reporting end of stream\n";
        }
        goto LAB_001036db;
      }
      goto LAB_00103722;
    }
  }
  else {
    uncompr = (uchar *)zng_gzerror(lVar10,&local_8038);
    pcVar7 = "gzputs err: %s\n";
LAB_001038e6:
    error(pcVar7,uncompr);
  }
  pcVar7 = "bad gzgets after gzseek\n";
  goto LAB_001036db;
LAB_00102aa1:
  do {
    local_8018 = CONCAT44(local_8018._4_4_,1);
    uVar9 = zng_deflate(&local_8038,4);
  } while ((int)uVar9 == 0);
  if ((int)uVar9 != 1) goto LAB_001036bd;
  uVar9 = zng_deflateEnd(&local_8038);
  if ((int)uVar9 != 0) goto LAB_001036f2;
  builtin_memcpy(uncompr,"garbage",8);
  local_7fe8 = 0;
  local_7ff8 = 0;
  uStack_7ff0 = 0;
  uStack_8030 = uStack_8030 & 0xffffffff00000000;
  local_8028 = 0;
  uStack_8010 = 0;
  local_8038 = (char *)compr;
  puStack_8020 = uncompr;
  uVar9 = zng_inflateInit();
  if ((int)uVar9 != 0) goto LAB_0010373e;
  do {
    iVar3 = (int)in_R8;
    if ((39999 < uStack_8010) || (39999 < local_8028)) goto LAB_00102b56;
    local_8018 = CONCAT44(local_8018._4_4_,1);
    uStack_8030 = CONCAT44(uStack_8030._4_4_,1);
    uVar9 = zng_inflate(&local_8038,0);
    iVar3 = (int)in_R8;
  } while ((int)uVar9 == 0);
  if ((int)uVar9 != 1) goto LAB_001036e2;
LAB_00102b56:
  uVar9 = zng_inflateEnd(&local_8038);
  if ((int)uVar9 != 0) {
LAB_00103751:
    pcVar7 = "inflateEnd";
    goto LAB_001036cb;
  }
  iVar5 = strcmp((char *)uncompr,"hello, hello!");
  if (iVar5 != 0) {
    pcVar7 = "bad inflate\n";
    goto LAB_001036db;
  }
  printf("inflate(): %s\n",uncompr);
  sVar16 = 0;
  test_large_deflate(compr,40000,uncompr,0,iVar3);
  test_large_inflate(compr,40000,uncompr,sVar16);
  sVar16 = 1;
  test_large_deflate(compr,40000,uncompr,1,iVar3);
  test_large_inflate(compr,40000,uncompr,sVar16);
  local_7ff8 = 0;
  uStack_7ff0 = 0;
  local_7fe8 = 0;
  uVar9 = zng_deflateInit(&local_8038,0xffffffff);
  if ((int)uVar9 != 0) goto LAB_00103712;
  local_8038 = "hello, hello!";
  uStack_8030 = CONCAT44(uStack_8030._4_4_,3);
  local_8018 = CONCAT44(local_8018._4_4_,40000);
  puStack_8020 = compr;
  uVar9 = zng_deflate(&local_8038,3);
  if ((int)uVar9 != 0) goto LAB_001036bd;
  compr[3] = compr[3] + '\x01';
  uStack_8030 = CONCAT44(uStack_8030._4_4_,0xb);
  uVar9 = zng_deflate(&local_8038,4);
  if (1 < (uint)uVar9) goto LAB_001036bd;
  uVar9 = zng_deflateEnd(&local_8038);
  uVar2 = uStack_8010;
  if ((int)uVar9 != 0) goto LAB_001036f2;
  builtin_memcpy(uncompr,"garbage",8);
  local_7ff8 = 0;
  uStack_7ff0 = 0;
  local_7fe8 = 0;
  uStack_8030 = CONCAT44(uStack_8030._4_4_,2);
  local_8038 = (char *)compr;
  uVar9 = zng_inflateInit();
  if ((int)uVar9 != 0) goto LAB_0010373e;
  local_8018 = CONCAT44(local_8018._4_4_,40000);
  puStack_8020 = uncompr;
  uVar9 = zng_inflate(&local_8038,0);
  if ((int)uVar9 != 0) goto LAB_001036e2;
  uStack_8030 = CONCAT44(uStack_8030._4_4_,(int)uVar2 + -2);
  uVar9 = zng_inflateSync();
  if ((int)uVar9 != 0) {
    pcVar7 = "inflateSync";
    goto LAB_001036cb;
  }
  iVar3 = zng_inflate(&local_8038,4);
  if (iVar3 != 1) {
    pcVar7 = "inflate should report Z_STREAM_END\n";
    goto LAB_001036db;
  }
  uVar9 = zng_inflateEnd(&local_8038);
  if ((int)uVar9 != 0) goto LAB_00103751;
  printf("after inflateSync(): hel%s\n",uncompr);
  uStack_7fe0 = uStack_7fe0 & 0xffffffff;
  local_7ff8 = 0;
  uStack_7ff0 = 0;
  local_7fe8 = 0;
  uVar9 = zng_deflateInit(&local_8038,9);
  if ((int)uVar9 != 0) goto LAB_00103712;
  uVar9 = zng_deflateSetDictionary(&local_8038,"hello",6);
  if ((int)uVar9 != 0) {
    pcVar7 = "deflateSetDictionary";
    goto LAB_001036cb;
  }
  dictId = uStack_7fe0 >> 0x20;
  local_8018 = CONCAT44(local_8018._4_4_,40000);
  local_8038 = "hello, hello!";
  uStack_8030 = CONCAT44(uStack_8030._4_4_,0xe);
  puStack_8020 = compr;
  iVar3 = zng_deflate(&local_8038,4);
  if (iVar3 == 1) {
    uVar9 = zng_deflateEnd(&local_8038);
    if ((int)uVar9 != 0) goto LAB_001036f2;
    local_80a4 = 0;
    builtin_memcpy(uncompr,"garbage garbage garbage",0x18);
    local_8044 = 0;
    local_8060 = 0;
    uStack_8058 = 0;
    local_8050 = 0;
    local_8098 = 40000;
    local_80a0 = compr;
    uVar9 = zng_inflateInit();
    if ((int)uVar9 == 0) {
      local_8080 = 40000;
      local_8088 = uncompr;
      do {
        uVar9 = zng_inflate(&local_80a0,0);
        if ((int)uVar9 == 2) {
          if (dictId != local_8044) goto LAB_001036d4;
          uVar9 = zng_inflateSetDictionary(&local_80a0,"hello",6);
        }
        else if ((int)uVar9 == 1) {
          uVar9 = zng_inflateGetDictionary(&local_80a0,0,&local_80a4);
          if ((int)uVar9 == 0) {
            if (local_80a4 < 6) {
              pcVar7 = "bad dictionary length\n";
              goto LAB_001036db;
            }
            uVar9 = zng_inflateGetDictionary(&local_80a0,&local_8038,&local_80a4);
            if ((int)uVar9 == 0) {
              if (local_8038._4_2_ != 0x6f || (int)local_8038 != 0x6c6c6568) {
                pcVar7 = "bad dictionary\n";
                goto LAB_001036db;
              }
              uVar9 = zng_inflateEnd(&local_80a0);
              if ((int)uVar9 != 0) goto LAB_00103751;
              iVar3 = strncmp((char *)uncompr,"hello, hello!",0xe);
              if (iVar3 != 0) {
                pcVar7 = "bad inflate with dict\n";
                goto LAB_001036db;
              }
              printf("inflate with dictionary: %s\n",uncompr);
              local_7fe8 = 0;
              local_7ff8 = 0;
              uStack_7ff0 = 0;
              uStack_8030 = CONCAT44(uStack_8030._4_4_,0xe);
              local_8038 = "hello, hello!";
              local_8018 = local_8018 & 0xffffffff00000000;
              puStack_8020 = (uchar *)0x0;
              uVar9 = zng_deflateInit(&local_8038,0xffffffff);
              if ((int)uVar9 != 0) goto LAB_00103712;
              iVar3 = zng_deflateBound(&local_8038,0xe);
              __ptr = (uchar *)malloc((long)iVar3);
              if (__ptr != (uchar *)0x0) {
                local_8018 = CONCAT44(local_8018._4_4_,iVar3);
                puStack_8020 = __ptr;
                uVar9 = zng_deflate(&local_8038,4);
                if ((int)uVar9 != 0) {
                  if ((int)uVar9 != 1) goto LAB_001036bd;
                  puts("deflateBound(): OK");
                }
              }
              uVar9 = zng_deflateEnd(&local_8038);
              if ((int)uVar9 != 0) goto LAB_001036f2;
              free(__ptr);
              local_8038 = (char *)0x0;
              uStack_8030 = 0;
              local_8028 = 0;
              puStack_8020 = (uchar *)0x0;
              local_8018 = 0;
              uStack_8010 = 0;
              local_8008 = 0;
              lStack_8000 = 0;
              local_7ff8 = 0;
              uStack_7ff0 = 0;
              local_7fe8 = 0;
              uStack_7fe0 = 0;
              local_7fd8 = 0;
              uVar9 = zng_deflateInit(&local_8038,0xffffffff);
              if ((int)uVar9 != 0) goto LAB_00103712;
              local_8038 = "hello, hello!";
              puStack_8020 = compr;
              goto LAB_00102fd7;
            }
          }
          pcVar7 = "inflateGetDictionary";
          goto LAB_001036cb;
        }
        if ((int)uVar9 != 0) {
          pcVar7 = "inflate with dict";
          goto LAB_001036cb;
        }
      } while( true );
    }
    goto LAB_0010373e;
  }
LAB_0010377c:
  pcVar7 = "deflate should report Z_STREAM_END\n";
LAB_001036db:
  do {
    error(pcVar7);
    uVar9 = extraout_RAX;
LAB_001036e2:
    pcVar7 = "inflate";
LAB_001036cb:
    error("%s error: %d\n",pcVar7,uVar9 & 0xffffffff);
LAB_001036d4:
    pcVar7 = "unexpected dictionary";
  } while( true );
  while( true ) {
    local_8018 = CONCAT44(local_8018._4_4_,1);
    uStack_8030 = CONCAT44(uStack_8030._4_4_,1);
    uVar9 = zng_deflate(&local_8038,0);
    if ((int)uVar9 != 0) break;
LAB_00102fd7:
    if ((local_8028 == 0xe) || (39999 < uStack_8010)) goto LAB_0010300e;
  }
LAB_001036bd:
  pcVar7 = "deflate";
  goto LAB_001036cb;
LAB_0010300e:
  do {
    local_8018 = CONCAT44(local_8018._4_4_,1);
    uVar9 = zng_deflate(&local_8038,4);
  } while ((int)uVar9 == 0);
  if ((int)uVar9 != 1) goto LAB_001036bd;
  uVar9 = zng_deflateCopy(&local_80a0,&local_8038);
  if ((int)uVar9 != 0) {
    pcVar7 = "deflate_copy";
    goto LAB_001036cb;
  }
  if (*(int *)(lStack_8000 + 0x30) == *(int *)(local_8068 + 0x30)) {
    puts("deflate_copy(): OK");
  }
  uVar9 = zng_deflateEnd(&local_8038);
  if ((int)uVar9 != 0) {
    pcVar7 = "deflateEnd original";
    goto LAB_001036cb;
  }
  uVar9 = zng_deflateEnd(&local_80a0);
  if ((int)uVar9 != 0) {
    pcVar7 = "deflateEnd copy";
    goto LAB_001036cb;
  }
  local_7ff8 = 0;
  uStack_7ff0 = 0;
  local_7fe8 = 0;
  uVar9 = zng_deflateInit(&local_8038,9);
  if ((int)uVar9 != 0) {
LAB_00103712:
    pcVar7 = "deflateInit";
    goto LAB_001036cb;
  }
  local_8018 = CONCAT44(local_8018._4_4_,40000);
  local_8038 = "hello, hello!";
  uStack_8030 = CONCAT44(uStack_8030._4_4_,0xe);
  puStack_8020 = compr;
  iVar3 = zng_deflate(&local_8038,4);
  if (iVar3 == 1) {
    pvVar15 = calloc(0x100,1);
    __ptr_00 = calloc(4,1);
    uVar9 = zng_deflateGetDictionary(&local_8038,pvVar15,__ptr_00);
    if ((int)uVar9 != 0) {
      pcVar7 = "deflateGetDictionary";
      goto LAB_001036cb;
    }
    printf("deflateGetDictionary(): %s\n",pvVar15);
    uVar9 = zng_deflateEnd(&local_8038);
    if ((int)uVar9 != 0) goto LAB_001036f2;
    free(pvVar15);
    free(__ptr_00);
    __ptr_01 = (undefined4 *)calloc(1,0x50);
    if (__ptr_01 != (undefined4 *)0x0) {
      local_7ff8 = 0;
      uStack_7ff0 = 0;
      local_7fe8 = 0;
      uVar9 = zng_deflateInit2(&local_8038,0xffffffff,8,0x1f,8,0);
      if ((int)uVar9 != 0) {
LAB_0010379b:
        pcVar7 = "deflateInit2";
        goto LAB_001036cb;
      }
      *__ptr_01 = 1;
      *(char **)(__ptr_01 + 0xe) = "comment";
      *(char **)(__ptr_01 + 10) = "name";
      __ptr_01[0x11] = 1;
      *(char **)(__ptr_01 + 6) = "extra";
      __ptr_01[8] = 5;
      uVar9 = zng_deflateSetHeader(&local_8038,__ptr_01);
      if ((int)uVar9 != 0) {
        pcVar7 = "deflateSetHeader";
        goto LAB_001036cb;
      }
      puts("deflateSetHeader(): OK");
      zng_deflateBound(&local_8038,40000);
      local_8038 = "hello, hello!";
      puStack_8020 = compr;
      do {
        if ((local_8028 == 0xe) || (39999 < uStack_8010)) goto LAB_00103250;
        local_8018 = CONCAT44(local_8018._4_4_,1);
        uStack_8030 = CONCAT44(uStack_8030._4_4_,1);
        uVar9 = zng_deflate(&local_8038,0);
      } while ((int)uVar9 == 0);
      goto LAB_001036bd;
    }
    goto LAB_00103770;
  }
  goto LAB_0010377c;
LAB_00103250:
  do {
    local_8018 = CONCAT44(local_8018._4_4_,1);
    uVar9 = zng_deflate(&local_8038,4);
  } while ((int)uVar9 == 0);
  if ((int)uVar9 == 1) {
    uVar9 = zng_deflateEnd(&local_8038);
    if ((int)uVar9 != 0) goto LAB_001036f2;
    free(__ptr_01);
    local_7ff8 = 0;
    uStack_7ff0 = 0;
    local_7fe8 = 0;
    uVar9 = zng_deflateInit(&local_8038,9);
    if ((int)uVar9 != 0) goto LAB_00103712;
    uVar9 = zng_deflateTune(&local_8038,3,5,0x12,6);
    if ((int)uVar9 != 0) {
      pcVar7 = "deflateTune";
      goto LAB_001036cb;
    }
    puts("deflateTune(): OK");
    local_8038 = "hello, hello!";
    puStack_8020 = compr;
    do {
      if ((local_8028 == 0xe) || (39999 < uStack_8010)) goto LAB_00103330;
      local_8018 = CONCAT44(local_8018._4_4_,1);
      uStack_8030 = CONCAT44(uStack_8030._4_4_,1);
      uVar9 = zng_deflate(&local_8038,0);
    } while ((int)uVar9 == 0);
  }
  goto LAB_001036bd;
LAB_00103330:
  do {
    local_8018 = CONCAT44(local_8018._4_4_,1);
    uVar9 = zng_deflate(&local_8038,4);
  } while ((int)uVar9 == 0);
  if ((int)uVar9 == 1) {
    uVar9 = zng_deflateEnd(&local_8038);
    if ((int)uVar9 != 0) {
LAB_001036f2:
      pcVar7 = "deflateEnd";
      goto LAB_001036cb;
    }
    __ptr_02 = (uint *)calloc(0x100,1);
    pvVar15 = calloc(0x100,1);
    local_7ff8 = 0;
    uStack_7ff0 = 0;
    local_7fe8 = 0;
    uVar9 = zng_deflateInit(&local_8038,0xffffffff);
    if ((int)uVar9 != 0) goto LAB_00103712;
    local_8038 = "hello, hello!";
    puStack_8020 = compr;
    do {
      if ((local_8028 == 0xe) || (39999 < uStack_8010)) {
        uVar9 = zng_deflatePending(&local_8038,pvVar15,__ptr_02);
        if ((int)uVar9 != 0) {
          pcVar7 = "deflatePending";
          goto LAB_001036cb;
        }
        pcVar7 = "deflatePending(): error";
        if (*__ptr_02 < 8) {
          pcVar7 = "deflatePending(): OK";
        }
        puts(pcVar7);
        do {
          local_8018 = CONCAT44(local_8018._4_4_,1);
          uVar9 = zng_deflate(&local_8038,4);
        } while ((int)uVar9 == 0);
        if ((int)uVar9 != 1) break;
        uVar9 = zng_deflateEnd(&local_8038);
        if ((int)uVar9 != 0) goto LAB_001036f2;
        free(__ptr_02);
        free(pvVar15);
        local_7ff8 = 0;
        uStack_7ff0 = 0;
        local_7fe8 = 0;
        uVar9 = zng_deflateInit2(&local_8038,0xffffffff,8,0xfffffff1,8,0);
        if ((int)uVar9 != 0) goto LAB_0010379b;
        uVar9 = zng_deflatePrime(&local_8038,0x10,0x8b1f);
        if ((((((int)uVar9 != 0) || (uVar9 = zng_deflatePrime(&local_8038,8,8), (int)uVar9 != 0)) ||
             (uVar9 = zng_deflatePrime(&local_8038,3,0), (int)uVar9 != 0)) ||
            ((uVar9 = zng_deflatePrime(&local_8038,5,0), (int)uVar9 != 0 ||
             (uVar9 = zng_deflatePrime(&local_8038,0x20,0), (int)uVar9 != 0)))) ||
           ((uVar9 = zng_deflatePrime(&local_8038,8,0), (int)uVar9 != 0 ||
            (uVar9 = zng_deflatePrime(&local_8038,8,0xff), (int)uVar9 != 0)))) {
LAB_00103702:
          pcVar7 = "deflatePrime";
          goto LAB_001036cb;
        }
        local_8038 = "hello, hello!";
        uStack_8030 = CONCAT44(uStack_8030._4_4_,0xe);
        local_8018 = CONCAT44(local_8018._4_4_,40000);
        puStack_8020 = compr;
        uVar9 = zng_deflate(&local_8038,4);
        if (1 < (uint)uVar9) break;
        uVar6 = zng_crc32(0,"hello, hello!",0xe);
        uVar9 = zng_deflatePrime(&local_8038,0x20,uVar6);
        if (((int)uVar9 != 0) || (uVar9 = zng_deflatePrime(&local_8038,0x20,0xe), (int)uVar9 != 0))
        goto LAB_00103702;
        uVar9 = zng_deflateEnd(&local_8038);
        if ((int)uVar9 != 0) goto LAB_001036f2;
        local_8060 = 0;
        uStack_8058 = 0;
        local_8050 = 0;
        local_8098 = (undefined4)uStack_8010;
        local_8080 = 40000;
        local_8090 = 0;
        local_8078 = 0;
        local_80a0 = compr;
        local_8088 = uncompr;
        uVar9 = zng_inflateInit2(&local_80a0,0x2f);
        if ((int)uVar9 != 0) goto LAB_0010373e;
        uVar9 = zng_inflate(&local_80a0,4);
        if (((int)uVar9 != -5) && ((int)uVar9 != 0)) goto LAB_001036e2;
        uVar9 = zng_inflateEnd(&local_80a0);
        if ((int)uVar9 != 0) goto LAB_00103751;
        iVar3 = strcmp((char *)uncompr,"hello, hello!");
        if (iVar3 == 0) {
          puts("deflatePrime(): OK");
          free(compr);
          free(uncompr);
          return 0;
        }
        pcVar7 = "bad deflatePrime\n";
        goto LAB_001036db;
      }
      local_8018 = CONCAT44(local_8018._4_4_,1);
      uStack_8030 = CONCAT44(uStack_8030._4_4_,1);
      uVar9 = zng_deflate(&local_8038,0);
    } while ((int)uVar9 == 0);
  }
  goto LAB_001036bd;
}

Assistant:

int main(int argc, char *argv[]) {
    unsigned char *compr, *uncompr;
    z_uintmax_t comprLen = 10000*sizeof(int); /* don't overflow on MSDOS */
    z_uintmax_t uncomprLen = comprLen;
    static const char* myVersion = PREFIX2(VERSION);

    if (zVersion()[0] != myVersion[0]) {
        fprintf(stderr, "incompatible zlib version\n");
        exit(1);

    } else if (strcmp(zVersion(), PREFIX2(VERSION)) != 0) {
        fprintf(stderr, "warning: different zlib version linked: %s\n", zVersion());
    }

    printf("zlib-ng version %s = 0x%08lx, compile flags = 0x%lx\n",
            ZLIBNG_VERSION, ZLIBNG_VERNUM, PREFIX(zlibCompileFlags)());

    compr    = (unsigned char*)calloc((unsigned int)comprLen, 1);
    uncompr  = (unsigned char*)calloc((unsigned int)uncomprLen, 1);
    /* compr and uncompr are cleared to avoid reading uninitialized
     * data and to ensure that uncompr compresses well.
     */
    if (compr == NULL || uncompr == NULL)
        error("out of memory\n");

    test_compress(compr, comprLen, uncompr, uncomprLen);

    test_gzio((argc > 1 ? argv[1] : TESTFILE),
              uncompr, uncomprLen);

    test_deflate(compr, comprLen);
    test_inflate(compr, comprLen, uncompr, uncomprLen);

    test_large_deflate(compr, comprLen, uncompr, uncomprLen, 0);
    test_large_inflate(compr, comprLen, uncompr, uncomprLen);

#ifndef ZLIB_COMPAT
    test_large_deflate(compr, comprLen, uncompr, uncomprLen, 1);
    test_large_inflate(compr, comprLen, uncompr, uncomprLen);
#endif

    test_flush(compr, &comprLen);
#ifdef ZLIBNG_ENABLE_TESTS
    test_sync(compr, comprLen, uncompr, uncomprLen);
#endif
    comprLen = uncomprLen;

    test_dict_deflate(compr, comprLen);
    test_dict_inflate(compr, comprLen, uncompr, uncomprLen);

    test_deflate_bound();
    test_deflate_copy(compr, comprLen);
    test_deflate_get_dict(compr, comprLen);
    test_deflate_set_header(compr, comprLen);
    test_deflate_tune(compr, comprLen);
    test_deflate_pending(compr, comprLen);
    test_deflate_prime(compr, comprLen, uncompr, uncomprLen);

    free(compr);
    free(uncompr);

    return 0;
}